

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O3

void test_archive_read_support(void)

{
  test_filter_or_format(archive_read_support_format_7zip);
  test_filter_or_format(archive_read_support_format_all);
  test_filter_or_format(archive_read_support_format_ar);
  test_filter_or_format(archive_read_support_format_cab);
  test_filter_or_format(archive_read_support_format_cpio);
  test_filter_or_format(archive_read_support_format_empty);
  test_filter_or_format(archive_read_support_format_iso9660);
  test_filter_or_format(archive_read_support_format_lha);
  test_filter_or_format(archive_read_support_format_mtree);
  test_filter_or_format(archive_read_support_format_tar);
  test_filter_or_format(archive_read_support_format_xar);
  test_filter_or_format(archive_read_support_format_zip);
  test_filter_or_format(archive_read_support_filter_all);
  test_filter_or_format(archive_read_support_filter_bzip2);
  test_filter_or_format(archive_read_support_filter_compress);
  test_filter_or_format(archive_read_support_filter_gzip);
  test_filter_or_format(archive_read_support_filter_lzip);
  test_filter_or_format(archive_read_support_filter_lzma);
  test_filter_or_format(archive_read_support_filter_none);
  test_filter_or_format(archive_read_support_filter_rpm);
  test_filter_or_format(archive_read_support_filter_uu);
  test_filter_or_format(archive_read_support_filter_xz);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_support)
{
	test_filter_or_format(archive_read_support_format_7zip);
	test_filter_or_format(archive_read_support_format_all);
	test_filter_or_format(archive_read_support_format_ar);
	test_filter_or_format(archive_read_support_format_cab);
	test_filter_or_format(archive_read_support_format_cpio);
	test_filter_or_format(archive_read_support_format_empty);
	test_filter_or_format(archive_read_support_format_iso9660);
	test_filter_or_format(archive_read_support_format_lha);
	test_filter_or_format(archive_read_support_format_mtree);
	test_filter_or_format(archive_read_support_format_tar);
	test_filter_or_format(archive_read_support_format_xar);
	test_filter_or_format(archive_read_support_format_zip);

	test_filter_or_format(archive_read_support_filter_all);
	test_filter_or_format(archive_read_support_filter_bzip2);
	test_filter_or_format(archive_read_support_filter_compress);
	test_filter_or_format(archive_read_support_filter_gzip);
	test_filter_or_format(archive_read_support_filter_lzip);
	test_filter_or_format(archive_read_support_filter_lzma);
	test_filter_or_format(archive_read_support_filter_none);
	test_filter_or_format(archive_read_support_filter_rpm);
	test_filter_or_format(archive_read_support_filter_uu);
	test_filter_or_format(archive_read_support_filter_xz);
}